

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<QGraphicsSceneBspTree::Node> * __thiscall
QList<QGraphicsSceneBspTree::Node>::fill
          (QList<QGraphicsSceneBspTree::Node> *this,parameter_type t,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<QGraphicsSceneBspTree::Node> *pQVar3;
  Node *b;
  Node *this_00;
  longlong *plVar4;
  DataOps *n;
  parameter_type in_RDX;
  __off_t __length;
  parameter_type in_RSI;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *in_RDI;
  long in_FS_OFFSET;
  Node copy;
  DataPointer detached;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *in_stack_ffffffffffffff68;
  parameter_type pNVar5;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffff88;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  anon_union_8_2_82aba17e_for_Node_0 local_38;
  undefined8 local_30;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> local_28;
  parameter_type local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RDX;
  if (in_RDX == (parameter_type)0xffffffffffffffff) {
    local_10 = (parameter_type)size((QList<QGraphicsSceneBspTree::Node> *)in_RDI);
  }
  QArrayDataPointer<QGraphicsSceneBspTree::Node>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QGraphicsSceneBspTree::Node>::needsDetach(in_stack_ffffffffffffff70);
  pNVar5 = local_10;
  if ((bVar1) ||
     (qVar2 = capacity((QList<QGraphicsSceneBspTree::Node> *)0xa19d82), qVar2 < (long)pNVar5)) {
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (Node *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QGraphicsSceneBspTree::Node>::operator->(in_RDI);
    QArrayDataPointer<QGraphicsSceneBspTree::Node>::detachCapacity
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QArrayDataPointer<QGraphicsSceneBspTree::Node>::QArrayDataPointer
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,
               (AllocationOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QGraphicsSceneBspTree::Node>::operator->(&local_28);
    QtPrivate::QPodArrayOps<QGraphicsSceneBspTree::Node>::copyAppend
              ((QPodArrayOps<QGraphicsSceneBspTree::Node> *)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,(parameter_type)in_stack_ffffffffffffff70);
    QArrayDataPointer<QGraphicsSceneBspTree::Node>::swap
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QArrayDataPointer<QGraphicsSceneBspTree::Node>::~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    local_38 = in_RSI->field_0;
    local_30 = *(undefined8 *)&in_RSI->type;
    pQVar3 = (QPodArrayOps<QGraphicsSceneBspTree::Node> *)
             QArrayDataPointer<QGraphicsSceneBspTree::Node>::operator->(in_RDI);
    b = QArrayDataPointer<QGraphicsSceneBspTree::Node>::begin
                  ((QArrayDataPointer<QGraphicsSceneBspTree::Node> *)0xa19e6e);
    this_00 = QArrayDataPointer<QGraphicsSceneBspTree::Node>::begin
                        ((QArrayDataPointer<QGraphicsSceneBspTree::Node> *)0xa19e7d);
    local_40 = size((QList<QGraphicsSceneBspTree::Node> *)in_RDI);
    plVar4 = qMin<long_long>(&local_40,(longlong *)&local_10);
    QtPrivate::QPodArrayOps<QGraphicsSceneBspTree::Node>::assign(pQVar3,b,this_00 + *plVar4,in_RSI);
    pNVar5 = local_10;
    qVar2 = size((QList<QGraphicsSceneBspTree::Node> *)in_RDI);
    if (qVar2 < (long)pNVar5) {
      n = QArrayDataPointer<QGraphicsSceneBspTree::Node>::operator->(in_RDI);
      pNVar5 = local_10;
      size((QList<QGraphicsSceneBspTree::Node> *)in_RDI);
      QtPrivate::QPodArrayOps<QGraphicsSceneBspTree::Node>::copyAppend
                ((QPodArrayOps<QGraphicsSceneBspTree::Node> *)this_00,(qsizetype)n,pNVar5);
    }
    else {
      pNVar5 = local_10;
      qVar2 = size((QList<QGraphicsSceneBspTree::Node> *)in_RDI);
      if ((long)pNVar5 < qVar2) {
        pQVar3 = (QPodArrayOps<QGraphicsSceneBspTree::Node> *)
                 QArrayDataPointer<QGraphicsSceneBspTree::Node>::operator->(in_RDI);
        QtPrivate::QPodArrayOps<QGraphicsSceneBspTree::Node>::truncate
                  (pQVar3,(char *)local_10,__length);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QGraphicsSceneBspTree::Node> *)in_RDI;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}